

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O1

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  Style SVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string eol;
  long *local_50 [2];
  long local_40 [2];
  
  this->NewLineStyle = Invalid;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar7 = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish == pbVar1;
  if (bVar7) goto LAB_002646af;
  iVar3 = std::__cxx11::string::compare((char *)pbVar1);
  uVar5 = 1;
  if (iVar3 != 0) {
    lVar6 = 0x20;
    do {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar7 = (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
              uVar5;
      if (bVar7) goto LAB_002646af;
      iVar3 = std::__cxx11::string::compare((char *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (iVar3 != 0);
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
    this = (cmNewLineStyle *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)errorString,0,(char *)errorString->_M_string_length,0x4c8867);
    goto LAB_002646af;
  }
  pcVar2 = pbVar1[uVar5]._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + pbVar1[uVar5]._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  SVar4 = LF;
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)) {
LAB_00264692:
    this->NewLineStyle = SVar4;
    this = (cmNewLineStyle *)0x1;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    SVar4 = CRLF;
    if ((iVar3 == 0) ||
       ((iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0 ||
        (iVar3 = std::__cxx11::string::compare((char *)local_50), iVar3 == 0)))) goto LAB_00264692;
    std::__cxx11::string::operator=
              ((string *)errorString,
               "NEWLINE_STYLE sets an unknown style, only LF, CRLF, UNIX, DOS, and WIN32 are supported"
              );
    this = (cmNewLineStyle *)0x0;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
LAB_002646af:
  return (bool)(bVar7 | (byte)this & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i< args.size(); i++)
    {
    if (args[i] == "NEWLINE_STYLE")
      {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex)
        {
        const std::string eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX")
          {
          NewLineStyle = LF;
          return true;
          }
        else if (eol == "CRLF" || eol == "WIN32" || eol == "DOS")
          {
          NewLineStyle = CRLF;
          return true;
          }
        else
          {
          errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                        "CRLF, UNIX, DOS, and WIN32 are supported";
          return false;
          }
        }
      else
        {
        errorString = "NEWLINE_STYLE must set a style: "
                      "LF, CRLF, UNIX, DOS, or WIN32";
        return false;
        }
      }
    }
  return true;
}